

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O1

void __thiscall RegionChecker::printRegions(RegionChecker *this)

{
  bool bVar1;
  ulong uVar2;
  int from;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar4) * 8 +
      (ulong)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
    bVar1 = false;
    from = 0;
    uVar2 = 0;
  }
  else {
    uVar5 = 0;
    uVar3 = 0;
    bVar1 = false;
    do {
      uVar2 = 1L << ((byte)uVar5 & 0x3f) & *(ulong *)(lVar4 + (uVar5 >> 6) * 8);
      if (bVar1) {
        if (uVar2 != 0) {
          printRange(this,(int)uVar3,(int)uVar5);
          bVar1 = false;
        }
      }
      else if (uVar2 == 0) {
        bVar1 = true;
        uVar3 = uVar5 & 0xffffffff;
      }
      from = (int)uVar3;
      uVar5 = uVar5 + 1;
      lVar4 = (long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar2 = (ulong)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar4) * 8;
    } while (uVar5 < uVar2);
  }
  if (bVar1) {
    printRange(this,from,(int)uVar2);
    return;
  }
  return;
}

Assistant:

void RegionChecker::printRegions() const {
	bool inUnusedRegion = false;
	int startMarker = 0;
	for (int i = 0; i < usedBits.size(); i++) {
		if (!inUnusedRegion && usedBits[i] == false) {
			inUnusedRegion = true;
			startMarker = i;
		}
		else if (inUnusedRegion && usedBits[i] == true) {
			inUnusedRegion = false;
			printRange(startMarker, i);
		}
	}
	if (inUnusedRegion) {
		printRange(startMarker, usedBits.size());
	}
}